

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-cbor.c
# Opt level: O2

cn_cbor * cn_cbor_decode(uchar *buf,size_t len,cn_cbor_errback *errp)

{
  anon_union_8_7_1acfe125_for_v *paVar1;
  byte bVar2;
  cn_cbor_type cVar3;
  ulong uVar4;
  cn_cbor *pcVar5;
  cn_cbor *pcVar6;
  byte *pbVar7;
  cn_cbor_error cVar8;
  cn_cbor *pcVar9;
  cn_cbor **ppcVar10;
  byte *pbVar11;
  byte *pbVar12;
  bool bVar13;
  int local_78;
  cn_cbor catcher;
  
  catcher.v.bytes = (uint8_t *)0x0;
  catcher.last_child = (cn_cbor *)0x0;
  catcher.next = (cn_cbor *)0x0;
  catcher.length = 0;
  catcher._20_4_ = 0;
  catcher.first_child = (cn_cbor *)0x0;
  catcher.parent = (cn_cbor *)0x0;
  catcher.type = CN_CBOR_INVALID;
  catcher.flags = 0;
  pbVar7 = buf + len;
  pcVar5 = (cn_cbor *)0x0;
  pcVar6 = &catcher;
  pbVar12 = buf;
LAB_0017cb11:
  pbVar11 = pbVar7;
  if (pbVar7 != pbVar12) {
    bVar2 = *pbVar12;
    pbVar11 = pbVar12 + 1;
    pbVar12 = pbVar11;
    if (bVar2 == 0xff) {
      if ((pcVar6->flags & CN_CBOR_FL_INDEF) == 0) {
        cVar8 = CN_CBOR_ERR_BREAK_OUTSIDE_INDEF;
        goto LAB_0017ce69;
      }
      cVar3 = pcVar6->type;
      pcVar9 = pcVar5;
      if (cVar3 - CN_CBOR_BYTES < 2) {
        pcVar6->type = cVar3 + CN_CBOR_NULL;
      }
      else if ((cVar3 == CN_CBOR_MAP) && ((pcVar6->length & 1) != 0)) {
        cVar8 = CN_CBOR_ERR_ODD_SIZE_INDEF_MAP;
        goto LAB_0017ce69;
      }
      do {
        do {
          pcVar5 = pcVar6;
          if (pcVar5 == &catcher) {
            if (pbVar11 == pbVar7) {
              if (pcVar9 != (cn_cbor *)0x0) {
                pcVar9->parent = (cn_cbor *)0x0;
                return pcVar9;
              }
              cVar8 = CN_CBOR_NO_ERROR;
              pbVar11 = pbVar7;
            }
            else {
              cVar8 = CN_CBOR_ERR_NOT_ALL_DATA_CONSUMED;
            }
            goto LAB_0017ce69;
          }
          pcVar6 = pcVar5->parent;
          if ((pcVar6->flags & CN_CBOR_FL_INDEF) != 0) {
            if (((pcVar6->type & ~CN_CBOR_TRUE) == CN_CBOR_BYTES) && (pcVar5->type != pcVar6->type))
            {
              cVar8 = CN_CBOR_ERR_WRONG_NESTING_IN_INDEF_STRING;
              goto LAB_0017ce69;
            }
            goto LAB_0017cb11;
          }
          pcVar9 = pcVar5;
        } while ((pcVar6->flags & CN_CBOR_FL_COUNT) == 0);
        paVar1 = &pcVar6->v;
        paVar1->bytes = (uint8_t *)(paVar1->sint + -1);
      } while (paVar1->bytes == (uint8_t *)0x0);
      goto LAB_0017cb11;
    }
    pcVar5 = (cn_cbor *)calloc(1,0x38);
    if (pcVar5 == (cn_cbor *)0x0) {
      cVar8 = CN_CBOR_ERR_OUT_OF_MEMORY;
      goto LAB_0017ce69;
    }
    uVar4 = (ulong)(bVar2 >> 5);
    pcVar5->type = mt_trans[uVar4];
    pcVar5->parent = pcVar6;
    ppcVar10 = &pcVar6->last_child->next;
    if (pcVar6->last_child == (cn_cbor *)0x0) {
      ppcVar10 = &pcVar6->first_child;
    }
    *ppcVar10 = pcVar5;
    pcVar6->last_child = pcVar5;
    pcVar6->length = pcVar6->length + 1;
    switch(bVar2 & 0x1f) {
    case 0x18:
      bVar13 = pbVar7 != pbVar11;
      pbVar11 = pbVar7;
      if (bVar13) {
        pcVar6 = (cn_cbor *)(*(code *)(&DAT_001f1510 + *(int *)(&DAT_001f1510 + uVar4 * 4)))();
        return pcVar6;
      }
      break;
    case 0x19:
      if (1 < (ulong)((long)pbVar7 - (long)pbVar11)) {
        pcVar6 = (cn_cbor *)(*(code *)(&DAT_001f1510 + *(int *)(&DAT_001f1510 + uVar4 * 4)))();
        return pcVar6;
      }
      break;
    case 0x1a:
      if (3 < (ulong)((long)pbVar7 - (long)pbVar11)) {
        pcVar6 = (cn_cbor *)(*(code *)(&DAT_001f1510 + *(int *)(&DAT_001f1510 + uVar4 * 4)))();
        return pcVar6;
      }
      break;
    case 0x1b:
      if (7 < (ulong)((long)pbVar7 - (long)pbVar11)) {
        pcVar6 = (cn_cbor *)(*(code *)(&DAT_001f1510 + *(int *)(&DAT_001f1510 + uVar4 * 4)))();
        return pcVar6;
      }
      break;
    case 0x1c:
    case 0x1d:
    case 0x1e:
      cVar8 = CN_CBOR_ERR_RESERVED_AI;
      goto LAB_0017ce69;
    case 0x1f:
      if (5 < (bVar2 >> 5) - 2) {
        cVar8 = CN_CBOR_ERR_MT_UNDEF_FOR_INDEF;
        goto LAB_0017ce69;
      }
      pcVar5->flags = CN_CBOR_FL_INDEF;
      pcVar6 = pcVar5;
      goto LAB_0017cb11;
    default:
      pcVar6 = (cn_cbor *)(*(code *)(&DAT_001f1510 + *(int *)(&DAT_001f1510 + uVar4 * 4)))();
      return pcVar6;
    }
  }
  cVar8 = CN_CBOR_ERR_OUT_OF_DATA;
LAB_0017ce69:
  if (catcher.first_child != (cn_cbor *)0x0) {
    (catcher.first_child)->parent = (cn_cbor *)0x0;
    cn_cbor_free(catcher.first_child);
  }
  if (errp != (cn_cbor_errback *)0x0) {
    errp->err = cVar8;
    local_78 = (int)buf;
    errp->pos = (int)pbVar11 - local_78;
  }
  return (cn_cbor *)0x0;
}

Assistant:

MYLIB_EXPORT
cn_cbor* cn_cbor_decode(const unsigned char* buf, size_t len CBOR_CONTEXT, cn_cbor_errback *errp) {
  cn_cbor catcher = {CN_CBOR_INVALID, 0, {0}, 0, NULL, NULL, NULL, NULL};
  struct parse_buf pb;
  cn_cbor* ret;

  pb.buf  = (unsigned char *)buf;
  pb.ebuf = (unsigned char *)buf+len;
  pb.err  = CN_CBOR_NO_ERROR;
  ret = decode_item(&pb CBOR_CONTEXT_PARAM, &catcher);
  if (ret != NULL) {
    /* mark as top node */
    ret->parent = NULL;
  } else {
    if (catcher.first_child) {
      catcher.first_child->parent = 0;
      cn_cbor_free(catcher.first_child CBOR_CONTEXT_PARAM);
    }
//fail:
    if (errp) {
      errp->err = pb.err;
      errp->pos = pb.buf - (unsigned char *)buf;
    }
    return NULL;
  }
  return ret;
}